

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

size_t secp256k1_pippenger_max_points(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  ulong local_38;
  
  lVar4 = 0;
  do {
    if (scratch->magic[lVar4] != "scratch"[lVar4]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      local_38 = 0;
      goto LAB_0014e144;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  uVar1 = scratch->max_size - scratch->alloc_size;
  local_38 = 0;
  if (0x59 < uVar1) {
    local_38 = uVar1 - 0x5a;
  }
LAB_0014e144:
  lVar4 = 1;
  bVar6 = 2;
  uVar1 = 0;
  while( true ) {
    if (lVar4 == 0xd) {
      return uVar1;
    }
    uVar2 = (ulong)(byte)(0x7f / bVar6);
    uVar5 = (0x98L << ((byte)lVar4 & 0x3f)) + uVar2 * 8 + 0x150;
    if (local_38 < uVar5) break;
    sVar3 = secp256k1_pippenger_bucket_window_inv((int)lVar4);
    uVar5 = (local_38 - uVar5) / (uVar2 * 8 + 0x140);
    uVar2 = uVar5;
    if (sVar3 <= uVar5) {
      uVar2 = sVar3;
    }
    if (uVar1 < uVar2) {
      uVar1 = uVar2;
    }
    bVar6 = bVar6 + 1;
    lVar4 = lVar4 + 1;
    if (uVar5 < sVar3) {
      return uVar1;
    }
  }
  return uVar1;
}

Assistant:

static size_t secp256k1_pippenger_max_points(const secp256k1_callback* error_callback, secp256k1_scratch *scratch) {
    size_t max_alloc = secp256k1_scratch_max_allocation(error_callback, scratch, PIPPENGER_SCRATCH_OBJECTS);
    int bucket_window;
    size_t res = 0;

    for (bucket_window = 1; bucket_window <= PIPPENGER_MAX_BUCKET_WINDOW; bucket_window++) {
        size_t n_points;
        size_t max_points = secp256k1_pippenger_bucket_window_inv(bucket_window);
        size_t space_for_points;
        size_t space_overhead;
        size_t entry_size = sizeof(secp256k1_ge) + sizeof(secp256k1_scalar) + sizeof(struct secp256k1_pippenger_point_state) + (WNAF_SIZE(bucket_window+1)+1)*sizeof(int);

        entry_size = 2*entry_size;
        space_overhead = (sizeof(secp256k1_gej) << bucket_window) + entry_size + sizeof(struct secp256k1_pippenger_state);
        if (space_overhead > max_alloc) {
            break;
        }
        space_for_points = max_alloc - space_overhead;

        n_points = space_for_points/entry_size;
        n_points = n_points > max_points ? max_points : n_points;
        if (n_points > res) {
            res = n_points;
        }
        if (n_points < max_points) {
            /* A larger bucket_window may support even more points. But if we
             * would choose that then the caller couldn't safely use any number
             * smaller than what this function returns */
            break;
        }
    }
    return res;
}